

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O2

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,ClassDeclaration *class_declaration)

{
  NewScopeLayer *parent;
  NewScopeLayer *this_00;
  Symbol local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)&class_declaration->class_name_);
  Symbol::Symbol(&local_88,&local_48);
  std::__cxx11::string::_M_assign((string *)&this->current_layer_->class_symbol_);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (NewScopeLayer *)operator_new(0x168);
  parent = this->current_layer_;
  std::__cxx11::string::string((string *)&local_68,(string *)&class_declaration->class_name_);
  local_88.name_._M_dataplus._M_p = (pointer)&local_88.name_.field_2;
  local_88.name_.field_2._M_allocated_capacity = 0;
  local_88.name_.field_2._8_8_ = 0;
  local_88.name_._M_string_length = 0;
  NewScopeLayer::NewScopeLayer
            (this_00,parent,&local_68,&this->current_layer_->class_symbol_,&local_88);
  this->current_layer_ = this_00;
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  (**(class_declaration->declarations_->super_Statement).super_Node._vptr_Node)
            (class_declaration->declarations_,this);
  this->current_layer_ = this->current_layer_->parent_;
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(ClassDeclaration* class_declaration) {
  current_layer_->class_symbol_ = Symbol(class_declaration->class_name_);
  // PreVisiting checks if class is already declared
  // new scope
  current_layer_ =
      new NewScopeLayer(current_layer_, class_declaration->class_name_,
                        current_layer_->class_symbol_, Symbol());

  class_declaration->declarations_->Accept(this);

  current_layer_ = current_layer_->parent_;
}